

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O1

bool __thiscall
candidate_index::CandidateIndex::structural_filter
          (CandidateIndex *this,
          vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
          *r,vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             *s,double t,int olap,int pr,int ps,int distance_threshold,int maxr,int maxs)

{
  LabelSetElement *sv_r;
  LabelSetElement *sv_s;
  pointer pLVar1;
  pointer pLVar2;
  int iVar3;
  double dVar4;
  
  dVar4 = (double)olap;
  if (t <= (double)maxr) {
    if ((t <= (double)maxs) && (dVar4 < t)) {
      pLVar1 = (r->
               super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pLVar2 = (s->
               super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      do {
        sv_r = pLVar1 + pr;
        sv_s = pLVar2 + ps;
        if (sv_r->id == sv_s->id) {
          iVar3 = structural_mapping(this,sv_r,sv_s,(double)distance_threshold);
          olap = olap + iVar3;
          maxr = (maxr + iVar3) - sv_r->weight;
          maxs = (maxs + iVar3) - sv_s->weight;
          pr = pr + 1;
LAB_00105d01:
          ps = ps + 1;
        }
        else {
          if (sv_s->id <= sv_r->id) {
            maxs = maxs - sv_s->weight;
            goto LAB_00105d01;
          }
          maxr = maxr - sv_r->weight;
          pr = pr + 1;
        }
        dVar4 = (double)olap;
      } while (((t <= (double)maxr) && (t <= (double)maxs)) && (dVar4 < t));
    }
  }
  return t <= dVar4;
}

Assistant:

bool CandidateIndex::structural_filter(
    std::vector<label_set_converter::LabelSetElement>& r, 
    std::vector<label_set_converter::LabelSetElement>& s, 
    const double t, 
    int olap, 
    int pr, 
    int ps, 
    int distance_threshold, 
    int maxr, 
    int maxs) {

  // starting from pr and ps, check if the overlap exceeds the threshold
  // stop if the threshold is reached or cannot be reached anymore
  while (maxr >= t && maxs >= t && olap < t) {
    if (r[pr].id == s[ps].id) {
      int tau_valid = structural_mapping(r[pr], s[ps], distance_threshold);
      olap += tau_valid;
      maxr -= r[pr].weight - tau_valid;
      maxs -= s[ps].weight - tau_valid;
      ++pr; ++ps; 
    } else if (r[pr].id < s[ps].id) {
      maxr -= r[pr].weight;
      ++pr;
    } else {
      maxs -= s[ps].weight;
      ++ps;
    }
  }

  return olap >= t;
}